

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__zhuffman_decode(stbi__zbuf *a,stbi__zhuffman *z)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (a->num_bits < 0x10) {
    stbi__fill_bits(a);
  }
  uVar2 = a->code_buffer;
  uVar1 = z->fast[uVar2 & 0x1ff];
  if (uVar1 == 0) {
    uVar1 = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
    uVar3 = (uVar1 & 0xf0f) << 4 | (uVar1 & 0xf0f0) >> 4;
    uVar3 = (uVar3 >> 2 & 0x3333) + (uVar3 & 0x3333) * 4;
    uVar3 = (uVar3 >> 1 & 0x5555) + (uVar3 & 0x5555) * 2;
    lVar5 = 0;
    do {
      lVar4 = lVar5;
      lVar5 = lVar4 + 1;
    } while (z->maxcode[lVar4 + 10] <= (int)uVar3);
    if (lVar5 == 7) {
      uVar2 = 0xffffffff;
    }
    else {
      lVar6 = (ulong)z->firstsymbol[lVar4 + 10] +
              ((ulong)(uVar3 >> (7U - (char)lVar5 & 0x1f)) - (ulong)z->firstcode[lVar4 + 10]);
      if ((ulong)*(byte *)((long)z + lVar6 + 0x484) - 9 != lVar5) {
        __assert_fail("z->size[b] == s",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                      ,0xf98,"int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
      }
      a->code_buffer = uVar2 >> ((char)lVar4 + 10U & 0x1f);
      a->num_bits = (a->num_bits - (int)lVar5) + -9;
      uVar2 = (uint)*(ushort *)((long)z + lVar6 * 2 + 0x5a4);
    }
  }
  else {
    a->code_buffer = uVar2 >> ((byte)(uVar1 >> 9) & 0x1f);
    a->num_bits = a->num_bits - (uint)(uVar1 >> 9);
    uVar2 = uVar1 & 0x1ff;
  }
  return uVar2;
}

Assistant:

stbi_inline static int stbi__zhuffman_decode(stbi__zbuf *a, stbi__zhuffman *z)
{
   int b,s;
   if (a->num_bits < 16) stbi__fill_bits(a);
   b = z->fast[a->code_buffer & STBI__ZFAST_MASK];
   if (b) {
      s = b >> 9;
      a->code_buffer >>= s;
      a->num_bits -= s;
      return b & 511;
   }
   return stbi__zhuffman_decode_slowpath(a, z);
}